

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O2

void __thiscall Updater::setUpdateAvailable(Updater *this,bool available)

{
  long lVar1;
  Downloader *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  byte bVar6;
  int iVar7;
  iterator iVar8;
  QArrayDataPointer<QString> local_108;
  QUrl url;
  QArrayDataPointer<char16_t> local_d8;
  QString title;
  QArrayDataPointer<char16_t> local_98;
  QMessageBox box;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  this->m_updateAvailable = available;
  QMessageBox::QMessageBox(&box,(QWidget *)0x0);
  QMessageBox::setTextFormat((TextFormat)&box);
  QMessageBox::setIcon((Icon)&box);
  if (this->m_updateAvailable == false) {
    bVar6 = this->m_notifyOnFinish;
  }
  else if ((this->m_notifyOnUpdate != false) ||
          (bVar6 = this->m_notifyOnFinish, (bool)bVar6 == true)) {
    tr((QString *)&local_d8,"Would you like to download the update now?",(char *)0x0,-1);
    if (this->m_mandatoryUpdate == true) {
      tr(&title,
         "Would you like to download the update now?<br />This is a mandatory update, exiting now will close the application."
         ,(char *)0x0,-1);
      qVar5 = local_d8.size;
      pcVar4 = local_d8.ptr;
      pDVar3 = local_d8.d;
      local_d8.d = title.d.d;
      local_d8.ptr = title.d.ptr;
      title.d.d = pDVar3;
      title.d.ptr = pcVar4;
      local_d8.size = title.d.size;
      title.d.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&title.d);
    }
    QString::operator+=((QString *)&local_d8,"<br/><br/>");
    if ((this->m_changelog).d.size != 0) {
      tr((QString *)&local_108,"<strong>Change log:</strong><br/>%1",(char *)0x0,-1);
      QString::arg((QString *)&title,(int)&local_108,(QChar)((short)this + L'x'));
      QString::append((QString *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&title.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    }
    tr((QString *)&local_28,"Version %1 of %2 has been released!",(char *)0x0,-1);
    local_40.d = (this->m_latestVersion).d.d;
    local_40.ptr = (this->m_latestVersion).d.ptr;
    local_40.size = (this->m_latestVersion).d.size;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&local_98,(int)&local_28,(QChar)(char16_t)&local_40);
    local_58.d = (this->m_moduleName).d.d;
    local_58.ptr = (this->m_moduleName).d.ptr;
    local_58.size = (this->m_moduleName).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&url,(int)&local_98,(QChar)(char16_t)&local_58);
    operator+((QString *)&local_108,"<h3>",(QString *)&url);
    operator+(&title,(QString *)&local_108,"</h3>");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&url);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QMessageBox::setText((QString *)&box);
    QMessageBox::setInformativeText((QString *)&box);
    QMessageBox::setStandardButtons(&box,0x14000);
    QMessageBox::setDefaultButton((StandardButton)&box);
    iVar7 = QDialog::exec();
    if (iVar7 == 0x4000) {
      local_108.d = (Data *)(this->m_openUrl).d.d;
      local_108.ptr = (QString *)(this->m_openUrl).d.ptr;
      lVar1 = (this->m_openUrl).d.size;
      if (local_108.d != (Data *)0x0) {
        LOCK();
        (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      local_108.size = lVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
      if (lVar1 == 0) {
        if (this->m_downloaderEnabled == true) {
          pDVar2 = this->m_downloader;
          local_108.d = (Data *)(this->m_url).d.d;
          local_108.ptr = (QString *)(this->m_url).d.ptr;
          local_108.size = (this->m_url).d.size;
          if (local_108.d != (Data *)0x0) {
            LOCK();
            (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          Downloader::setUrlId(pDVar2,(QString *)&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108)
          ;
          pDVar2 = this->m_downloader;
          url.d = (QUrlPrivate *)(this->m_downloadUrl).d.d;
          if (url.d != (QUrlPrivate *)0x0) {
            LOCK();
            *(int *)url.d = *(int *)url.d + 1;
            UNLOCK();
          }
          QString::QString((QString *)&local_98,"/");
          QString::split(&local_108,&url,&local_98,0,1);
          iVar8 = QList<QString>::end((QList<QString> *)&local_108);
          Downloader::setFileName(pDVar2,iVar8.i + -1);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&url);
          Downloader::setMandatoryUpdate(this->m_downloader,this->m_mandatoryUpdate);
          local_108.d = (Data *)(this->m_downloadUrl).d.d;
          local_108.ptr = (QString *)(this->m_downloadUrl).d.ptr;
          local_108.size = (this->m_downloadUrl).d.size;
          if (local_108.d != (Data *)0x0) {
            LOCK();
            (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          QUrl::QUrl(&url,(QString *)&local_108,TolerantMode);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108)
          ;
          QUrl::setUserName((QString *)&url,(int)this + 0xf0);
          QUrl::setPassword((QString *)&url,(int)this + 0x108);
          Downloader::startDownload(this->m_downloader,&url);
          QUrl::~QUrl(&url);
          goto LAB_0010f116;
        }
        local_108.d = (Data *)(this->m_downloadUrl).d.d;
        local_108.ptr = (QString *)(this->m_downloadUrl).d.ptr;
        local_108.size = (this->m_downloadUrl).d.size;
        if (local_108.d != (Data *)0x0) {
          LOCK();
          (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        QUrl::QUrl(&url,(QString *)&local_108,TolerantMode);
        QDesktopServices::openUrl(&url);
      }
      else {
        local_108.d = (Data *)(this->m_openUrl).d.d;
        local_108.ptr = (QString *)(this->m_openUrl).d.ptr;
        local_108.size = (this->m_openUrl).d.size;
        if (local_108.d != (Data *)0x0) {
          LOCK();
          (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (((Data *)local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        QUrl::QUrl(&url,(QString *)&local_108,TolerantMode);
        QDesktopServices::openUrl(&url);
      }
      QUrl::~QUrl(&url);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    }
    else if (this->m_mandatoryUpdate == true) {
      QCoreApplication::quit();
    }
LAB_0010f116:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&title.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    goto LAB_0010f12a;
  }
  if ((bVar6 & 1) != 0) {
    QMessageBox::setStandardButtons(&box,0x200000);
    tr((QString *)&local_d8,"No updates are available for the moment",(char *)0x0,-1);
    QMessageBox::setInformativeText((QString *)&box);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    tr((QString *)&url,"Congratulations! You are running the latest version of %1",(char *)0x0,-1);
    local_98.d = (this->m_moduleName).d.d;
    local_98.ptr = (this->m_moduleName).d.ptr;
    local_98.size = (this->m_moduleName).d.size;
    if (local_98.d != (Data *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::arg((QString *)&local_108,(int)&url,(QChar)(char16_t)&local_98);
    operator+(&title,"<h3>",(QString *)&local_108);
    operator+((QString *)&local_d8,&title,"</h3>");
    QMessageBox::setText((QString *)&box);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&title.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&url);
    QDialog::exec();
  }
LAB_0010f12a:
  QMessageBox::~QMessageBox(&box);
  return;
}

Assistant:

void Updater::setUpdateAvailable(const bool available)
{
   m_updateAvailable = available;

   QMessageBox box;
   box.setTextFormat(Qt::RichText);
   box.setIcon(QMessageBox::Information);

   if (updateAvailable() && (notifyOnUpdate() || notifyOnFinish()))
   {
      QString text = tr("Would you like to download the update now?");
      if (m_mandatoryUpdate)
      {
         text = tr("Would you like to download the update now?<br />This is a mandatory update, exiting now will close "
                   "the application.");
      }
      text += "<br/><br/>";
      if (!m_changelog.isEmpty())
         text += tr("<strong>Change log:</strong><br/>%1").arg(m_changelog);

      QString title
          = "<h3>" + tr("Version %1 of %2 has been released!").arg(latestVersion()).arg(moduleName()) + "</h3>";

      box.setText(title);
      box.setInformativeText(text);
      box.setStandardButtons(QMessageBox::No | QMessageBox::Yes);
      box.setDefaultButton(QMessageBox::Yes);

      if (box.exec() == QMessageBox::Yes)
      {
         if (!openUrl().isEmpty())
            QDesktopServices::openUrl(QUrl(openUrl()));

         else if (downloaderEnabled())
         {
            m_downloader->setUrlId(url());
            m_downloader->setFileName(downloadUrl().split("/").last());
            m_downloader->setMandatoryUpdate(m_mandatoryUpdate);
            auto url = QUrl(downloadUrl());
            url.setUserName(m_downloadUserName);
            url.setPassword(m_downloadPassword);
            m_downloader->startDownload(url);
         }

         else
            QDesktopServices::openUrl(QUrl(downloadUrl()));
      }
      else
      {
         if (m_mandatoryUpdate)
         {
            QApplication::quit();
         }
      }
   }

   else if (notifyOnFinish())
   {
      box.setStandardButtons(QMessageBox::Close);
      box.setInformativeText(tr("No updates are available for the moment"));
      box.setText("<h3>"
                  + tr("Congratulations! You are running the "
                       "latest version of %1")
                        .arg(moduleName())
                  + "</h3>");

      box.exec();
   }
}